

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_histogram<long,_(unsigned_char)'\x02'>::basic_dynamic_histogram
          (basic_dynamic_histogram<long,_(unsigned_char)__x02_> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *buckets,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name)

{
  ulong uVar1;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  local_70;
  
  std::__cxx11::string::string((string *)&local_90,name);
  std::__cxx11::string::string((string *)(local_c0 + 0x10),help);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  array(&local_70,labels_name);
  dynamic_metric::metric_t<2ul>
            (&this->super_dynamic_metric,Histogram,&local_90,(string *)(local_c0 + 0x10),&local_70);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array(&local_70);
  std::__cxx11::string::~string((string *)(local_c0 + 0x10));
  std::__cxx11::string::~string((string *)&local_90);
  (this->super_dynamic_metric).super_metric_t._vptr_metric_t =
       (_func_int **)&PTR__basic_dynamic_histogram_001e92c8;
  std::vector<double,_std::allocator<double>_>::vector(&this->bucket_boundaries_,buckets);
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<ylt::metric::basic_dynamic_gauge<long,(unsigned_char)2>,std::__cxx11::string&,std::__cxx11::string&,std::array<std::__cxx11::string,2ul>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->sum_,name,
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)help);
  for (uVar1 = 0;
      uVar1 < ((long)(buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) + 1U; uVar1 = uVar1 + 1) {
    std::
    make_shared<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>,std::__cxx11::string&,std::__cxx11::string&,std::array<std::__cxx11::string,2ul>&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,name,
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                *)help);
    std::
    vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>,std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>>>
    ::emplace_back<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>>
              ((vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>,std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>>>
                *)&this->bucket_counts_,
               (shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_> *)
               local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  }
  return;
}

Assistant:

basic_dynamic_histogram(std::string name, std::string help,
                          std::vector<double> buckets,
                          std::array<std::string, N> labels_name)
      : bucket_boundaries_(buckets),
        dynamic_metric(MetricType::Histogram, name, help, labels_name),
        sum_(std::make_shared<basic_dynamic_gauge<value_type, N>>(
            name, help, labels_name)) {
    for (size_t i = 0; i < buckets.size() + 1; i++) {
      bucket_counts_.push_back(
          std::make_shared<basic_dynamic_counter<value_type, N>>(name, help,
                                                                 labels_name));
    }
  }